

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapInsertNode(jx9_hashmap *pMap,jx9_hashmap_node *pNode,int bPreserve)

{
  sxi32 sVar1;
  jx9_value *pValue;
  
  pValue = HashmapExtractNodeValue(pNode);
  if (pValue == (jx9_value *)0x0) {
    return 0;
  }
  if (pNode->iType == 1) {
    sVar1 = HashmapInsertIntKey(pMap,(pNode->xKey).iKey,pValue);
    return sVar1;
  }
  sVar1 = HashmapInsertBlobKey(pMap,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,pValue);
  return sVar1;
}

Assistant:

static sxi32 HashmapInsertNode(jx9_hashmap *pMap, jx9_hashmap_node *pNode, int bPreserve)
{
	jx9_value *pObj;
	sxi32 rc;
	/* Extract the node value */
	pObj = HashmapExtractNodeValue(&(*pNode));
	if( pObj == 0 ){
		return SXERR_EMPTY;
	}
	/* Preserve key */
	if( pNode->iType == HASHMAP_INT_NODE){
		/* Int64 key */
		if( !bPreserve ){
			/* Assign an automatic index */
			rc = HashmapInsert(&(*pMap), 0, pObj);
		}else{
			rc = HashmapInsertIntKey(&(*pMap), pNode->xKey.iKey, pObj);
		}
	}else{
		/* Blob key */
		rc = HashmapInsertBlobKey(&(*pMap), SyBlobData(&pNode->xKey.sKey), 
			SyBlobLength(&pNode->xKey.sKey), pObj);
	}
	return rc;
}